

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directory.cxx
# Opt level: O1

Status __thiscall kwssys::Directory::Load(Directory *this,string *name,string *errorMessage)

{
  int *piVar1;
  DIR *__dirp;
  dirent *pdVar2;
  char *pcVar3;
  Status SVar4;
  allocator local_49;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  std::__cxx11::string::resize((ulong)&this->Internal->Path,'\0');
  std::
  vector<kwssys::DirectoryInternals::FileData,_std::allocator<kwssys::DirectoryInternals::FileData>_>
  ::clear(&this->Internal->Files);
  piVar1 = __errno_location();
  *piVar1 = 0;
  __dirp = opendir((name->_M_dataplus)._M_p);
  if (__dirp != (DIR *)0x0) {
    *piVar1 = 0;
    while (pdVar2 = readdir(__dirp), pdVar2 != (dirent *)0x0) {
      std::
      vector<kwssys::DirectoryInternals::FileData,std::allocator<kwssys::DirectoryInternals::FileData>>
      ::emplace_back<char(&)[256]>
                ((vector<kwssys::DirectoryInternals::FileData,std::allocator<kwssys::DirectoryInternals::FileData>>
                  *)this->Internal,&pdVar2->d_name);
    }
    if (*piVar1 == 0) {
      std::__cxx11::string::_M_assign((string *)&this->Internal->Path);
      closedir(__dirp);
      SVar4.Kind_ = Success;
      SVar4.field_1 = (anon_union_4_1_2e27bb9a_for_Status_2)0x0;
      return SVar4;
    }
  }
  if (errorMessage != (string *)0x0) {
    pcVar3 = strerror(*piVar1);
    std::__cxx11::string::string((string *)local_48,pcVar3,&local_49);
    std::__cxx11::string::operator=((string *)errorMessage,(string *)local_48);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  SVar4 = Status::POSIX_errno();
  return SVar4;
}

Assistant:

Status Directory::Load(std::string const& name, std::string* errorMessage)
{
  this->Clear();

  errno = 0;
  DIR* dir = opendir(name.c_str());

  if (!dir) {
    if (errorMessage != nullptr) {
      *errorMessage = std::string(strerror(errno));
    }
    return Status::POSIX_errno();
  }

  errno = 0;
  for (kwsys_dirent* d = readdir(dir); d; d = readdir(dir)) {
    this->Internal->Files.emplace_back(d->d_name);
  }
  if (errno != 0) {
    if (errorMessage != nullptr) {
      *errorMessage = std::string(strerror(errno));
    }
    return Status::POSIX_errno();
  }

  this->Internal->Path = name;
  closedir(dir);
  return Status::Success();
}